

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

const_iterator __thiscall QHash<QString,_QString>::begin(QHash<QString,_QString> *this)

{
  piter pVar1;
  piter it;
  long *in_RDI;
  long in_FS_OFFSET;
  const_iterator *in_stack_ffffffffffffffb8;
  Data<QHashPrivate::Node<QString,_QString>_> *in_stack_ffffffffffffffc0;
  Data<QHashPrivate::Node<QString,_QString>_> *local_30;
  Data<QHashPrivate::Node<QString,_QString>_> *local_18;
  size_t local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (*in_RDI == 0) {
    memset(&local_18,0,0x10);
    const_iterator::const_iterator((const_iterator *)0x2a9943);
  }
  else {
    QHashPrivate::Data<QHashPrivate::Node<QString,_QString>_>::begin(local_30);
    it.bucket = (size_t)in_RDI;
    it.d = in_stack_ffffffffffffffc0;
    const_iterator::const_iterator(in_stack_ffffffffffffffb8,it);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    pVar1.bucket = local_10;
    pVar1.d = local_18;
    return (const_iterator)pVar1;
  }
  __stack_chk_fail();
}

Assistant:

inline const_iterator begin() const noexcept { return d ? const_iterator(d->begin()): const_iterator(); }